

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManHasNoEquivs(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_24;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    p_local._4_4_ = 1;
  }
  else {
    local_24 = 0;
    while( true ) {
      bVar3 = false;
      if (local_24 < p->nObjs) {
        pGVar2 = Gia_ManObj(p,local_24);
        bVar3 = pGVar2 != (Gia_Obj_t *)0x0;
      }
      if ((!bVar3) || (pGVar2 = Gia_ObjReprObj(p,local_24), pGVar2 != (Gia_Obj_t *)0x0)) break;
      local_24 = local_24 + 1;
    }
    iVar1 = Gia_ManObjNum(p);
    p_local._4_4_ = (uint)(local_24 == iVar1);
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    [Returns 1 if AIG has dangling nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManHasNoEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->pReprs == NULL )
        return 1;
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    return i == Gia_ManObjNum(p);
}